

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int ReadInt64(unqlite_file *pFd,sxu64 *pOut,sxi64 iOfft)

{
  int iVar1;
  uchar zBuf [8];
  ulong local_10;
  
  iVar1 = (*pFd->pMethods->xRead)(pFd,&local_10,8,iOfft);
  if (iVar1 == 0) {
    *pOut = local_10 >> 0x38 | (local_10 & 0xff000000000000) >> 0x28 |
            (local_10 & 0xff0000000000) >> 0x18 | (local_10 & 0xff00000000) >> 8 |
            (local_10 & 0xff000000) << 8 | (local_10 & 0xff0000) << 0x18 |
            (local_10 & 0xff00) << 0x28 | local_10 << 0x38;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int ReadInt64(unqlite_file *pFd,sxu64 *pOut,sxi64 iOfft)
{
	unsigned char zBuf[8];
	int rc;
	rc = unqliteOsRead(pFd,zBuf,sizeof(zBuf),iOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	SyBigEndianUnpack64(zBuf,pOut);
	return UNQLITE_OK;
}